

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.hpp
# Opt level: O2

string * __thiscall
KokkosTools::demangleNameKokkos_abi_cxx11_
          (string *__return_storage_ptr__,KokkosTools *this,string_view mangled_name)

{
  size_type __n;
  string *psVar1;
  string_view in_stack_ffffffffffffff58;
  string_view mangled_name_local;
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  mangled_name_local._M_str = (char *)mangled_name._M_len;
  mangled_name_local._M_len = (size_t)this;
  __n = std::basic_string_view<char,_std::char_traits<char>_>::find(&mangled_name_local,'/',0);
  if (__n - 1 < 0xfffffffffffffffe) {
    local_28 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&mangled_name_local,0,__n);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_48,&local_28,(allocator<char> *)&stack0xffffffffffffff67);
    demangleName_abi_cxx11_(in_stack_ffffffffffffff58);
    psVar1 = (string *)std::__cxx11::string::append((char *)local_68);
    std::basic_string_view<char,_std::char_traits<char>_>::substr
              (&mangled_name_local,__n + 1,mangled_name_local._M_len);
    demangleName_abi_cxx11_(in_stack_ffffffffffffff58);
    psVar1 = (string *)std::__cxx11::string::append(psVar1);
    std::__cxx11::string::string((string *)__return_storage_ptr__,psVar1);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_48);
  }
  else {
    demangleName_abi_cxx11_(in_stack_ffffffffffffff58);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string demangleNameKokkos(const std::string_view mangled_name) {
  if (size_t pos = mangled_name.find('/', 0);
      pos != std::string_view::npos && pos > 0) {
    /// An explicit copy of the first part of the string is needed, because
    /// @c abi::__cxa_demangle will parse the pointer until its NULL-terminated.
    return demangleName(std::string(mangled_name.substr(0, pos)))
        .append("/")
        .append(
            demangleName(mangled_name.substr(pos + 1, mangled_name.size())));
  } else {
    return demangleName(mangled_name);
  }
}